

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitArraySet(PrintExpressionContents *this,ArraySet *curr)

{
  HeapType type;
  string_view str;
  
  str._M_str = "array.set ";
  str._M_len = 10;
  printMedium(this->o,str);
  type = wasm::Type::getHeapType(&curr->ref->type);
  printHeapTypeName(this,type);
  return;
}

Assistant:

void visitArraySet(ArraySet* curr) {
    printMedium(o, "array.set ");
    printHeapTypeName(curr->ref->type.getHeapType());
  }